

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

USHORT __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::QueryDepth(ZeroPageQueue *this)

{
  CriticalSection *this_00;
  USHORT UVar1;
  FreePageEntry *pFVar2;
  
  this_00 = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&this_00->super_CCLock);
  pFVar2 = (FreePageEntry *)&this->pendingZeroPageList;
  UVar1 = 0xffff;
  do {
    pFVar2 = pFVar2->Next;
    UVar1 = UVar1 + 1;
  } while (pFVar2 != (FreePageEntry *)0x0);
  CCLock::Leave(&this_00->super_CCLock);
  return UVar1;
}

Assistant:

USHORT QueryDepth()
        {
#if SUPPORT_WIN32_SLIST
            return QueryDepthSList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            size_t count = 0;
            while (head)
            {
                head = head->Next;
                count++;
            }
            // If the specified singly linked list contains more than 65535 entries, QueryDepthSList returns the number of entries in the list modulo 65535
            return (USHORT)(count % 65536);
#endif
        }